

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O0

void __thiscall
defyx::VmBase<defyx::AlignedAllocator<64UL>,_false>::~VmBase
          (VmBase<defyx::AlignedAllocator<64UL>,_false> *this)

{
  undefined8 *in_RDI;
  void *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__VmBase_0016b7c8;
  AlignedAllocator<64UL>::freeMemory(in_stack_ffffffffffffffe8,0x133fc2);
  defyx_vm::~defyx_vm((defyx_vm *)0x133fce);
  return;
}

Assistant:

VmBase<Allocator, softAes>::~VmBase() {
		Allocator::freeMemory(scratchpad, ScratchpadSize);
	}